

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

object __thiscall
pybind11::detail::
object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::operator()
          (object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
           *this,object *args,str *args_1)

{
  int iVar1;
  str *in_RCX;
  object local_30;
  
  iVar1 = PyGILState_Check();
  if (iVar1 != 0) {
    make_tuple<(pybind11::return_value_policy)1,pybind11::object&,pybind11::str>
              ((pybind11 *)&local_30,&args_1->super_object,in_RCX);
    accessor<pybind11::detail::accessor_policies::str_attr>::ptr
              ((accessor<pybind11::detail::accessor_policies::str_attr> *)args);
    simple_collector<(pybind11::return_value_policy)1>::call
              ((simple_collector<(pybind11::return_value_policy)1> *)this,(PyObject *)&local_30);
    object::~object(&local_30);
    return (object)(handle)this;
  }
  pybind11_fail("pybind11::object_api<>::operator() PyGILState_Check() failure.");
}

Assistant:

object object_api<Derived>::operator()(Args &&...args) const {
#if !defined(NDEBUG) && PY_VERSION_HEX >= 0x03060000
    if (!PyGILState_Check()) {
        pybind11_fail("pybind11::object_api<>::operator() PyGILState_Check() failure.");
    }
#endif
    return detail::collect_arguments<policy>(std::forward<Args>(args)...).call(derived().ptr());
}